

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::ArealObjectAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ArealObjectAppearance *this)

{
  ostream *poVar1;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  ArealObjectAppearance *local_18;
  ArealObjectAppearance *this_local;
  
  local_18 = this;
  this_local = (ArealObjectAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  ObjectAppearance::GetAsString_abi_cxx11_(&local_1c0,&this->super_ObjectAppearance);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tSpecific Appearance: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(uint *)&(this->super_ObjectAppearance).field_0xc);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ArealObjectAppearance::GetAsString() const
{
    KStringStream ss;

    ss << ObjectAppearance::GetAsString()
       << "\tSpecific Appearance: " << m_SpecificAppearanceUnion.m_ui32SpecificAppearance << "\n";

    return ss.str();
}